

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

double bson_iter_as_double(bson_iter_t *iter)

{
  _Bool _Var1;
  int32_t iVar2;
  int64_t iVar3;
  bson_iter_t *iter_local;
  
  if (iter != (bson_iter_t *)0x0) {
    switch(iter->raw[iter->type]) {
    case '\x01':
      iter_local = (bson_iter_t *)bson_iter_double(iter);
      break;
    default:
      iter_local = (bson_iter_t *)0x0;
      break;
    case '\b':
      _Var1 = bson_iter_bool(iter);
      iter_local = (bson_iter_t *)(double)_Var1;
      break;
    case '\x10':
      iVar2 = bson_iter_int32(iter);
      iter_local = (bson_iter_t *)(double)iVar2;
      break;
    case '\x12':
      iVar3 = bson_iter_int64(iter);
      iter_local = (bson_iter_t *)(double)iVar3;
    }
    return (double)iter_local;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x403,"bson_iter_as_double","iter");
  abort();
}

Assistant:

double
bson_iter_as_double (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);

   switch ((int) ITER_TYPE (iter)) {
   case BSON_TYPE_BOOL:
      return (double) bson_iter_bool (iter);
   case BSON_TYPE_DOUBLE:
      return bson_iter_double (iter);
   case BSON_TYPE_INT32:
      return (double) bson_iter_int32 (iter);
   case BSON_TYPE_INT64:
      return (double) bson_iter_int64 (iter);
   default:
      return 0;
   }
}